

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall
denialofservice_tests::OutboundTest::AddRandomOutboundPeer
          (OutboundTest *this,NodeId *id,vector<CNode_*,_std::allocator<CNode_*>_> *vNodes,
          PeerManager *peerLogic,ConnmanTestMsg *connman,ConnectionType connType,bool onion_peer)

{
  long idIn;
  readonly_property65 rVar1;
  bool bVar2;
  uint64_t uVar3;
  CNode *pCVar4;
  ConnmanTestMsg *pCVar5;
  undefined4 in_register_0000008c;
  string *psVar6;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> addr;
  const_string msg;
  shared_ptr<Sock> sock;
  check_type cVar7;
  CNodeOptions *node_opts;
  undefined1 local_188 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  assertion_result local_158;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 local_120 [8];
  __uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> local_118;
  undefined1 *local_110;
  char **local_108;
  undefined1 local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tor_addr;
  direct_or_indirect local_d8;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined2 local_b8;
  direct_or_indirect local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined2 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  direct_or_indirect local_78;
  uint local_68;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = connman;
  psVar6 = (string *)CONCAT44(in_register_0000008c,connType);
  CService::CService((CService *)&local_78.indirect_contents);
  local_50 = 100000000;
  uStack_48 = 0;
  if (onion_peer) {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&tor_addr,
               &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                super_RandomMixin<FastRandomContext>,0x20);
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x74;
    file.m_begin = (iterator)&local_130;
    msg.m_end = (iterator)psVar6;
    msg.m_begin = (iterator)pCVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
    addr.m_size = (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    addr.m_data = tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    OnionToString_abi_cxx11_((string *)&local_b0.indirect_contents,addr);
    _cVar7 = 0x3875c2;
    rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         CNetAddr::SetSpecial
                   ((CNetAddr *)&local_78.indirect_contents,(string *)&local_b0.indirect_contents);
    local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
    local_158.m_message.px = (element_type *)0x0;
    local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_108 = &local_168;
    local_168 = "addr.SetSpecial(OnionToString(tor_addr))";
    local_160 = "";
    local_118._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
         ((ulong)local_118._M_t.
                 super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                 .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl &
         0xffffffffffffff00);
    local_120 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_170 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_158,(lazy_ostream *)local_120,2,0,WARN,_cVar7,(size_t)&local_178,0x74);
    boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.indirect_contents.indirect != &local_a0) {
      operator_delete(local_b0.indirect_contents.indirect,
                      CONCAT44(local_a0._M_allocated_capacity._4_4_,
                               local_a0._M_allocated_capacity._0_4_) + 1);
    }
    if (tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  while( true ) {
    bVar2 = CNetAddr::IsRoutable((CNetAddr *)&local_78.indirect_contents);
    if (bVar2) break;
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                        m_rng.super_RandomMixin<FastRandomContext>,0x20);
    ip((CService *)&local_d8.indirect_contents,(uint32_t)uVar3);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents);
    local_a0._8_8_ = local_c0;
    local_90 = local_b8;
    local_88 = 100000000;
    uStack_80 = 0;
    if (0x10 < local_68) {
      free(local_78.indirect_contents.indirect);
    }
    local_78.indirect_contents.indirect = local_b0.indirect_contents.indirect;
    local_78._8_8_ = local_b0._8_8_;
    local_68 = local_a0._M_allocated_capacity._0_4_;
    local_a0._M_allocated_capacity._0_4_ = 0;
    local_50 = local_88;
    uStack_48 = uStack_80;
    local_60 = local_a0._8_8_;
    local_58 = local_90;
    if (0x10 < (uint)local_c8) {
      free(local_d8.indirect_contents.indirect);
      local_d8.indirect_contents.indirect = (char *)0x0;
    }
  }
  pCVar4 = (CNode *)operator_new(0x3a8);
  idIn = *id;
  *id = idIn + 1;
  local_188 = (undefined1  [8])0x0;
  p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_b0.indirect_contents);
  local_88 = 100000000;
  uStack_80 = 0;
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  node_opts = (CNodeOptions *)0x387832;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tor_addr,"");
  local_120 = (undefined1  [8])((ulong)local_120 & 0xffffffff00000000);
  local_118._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
       (_Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)0x0;
  local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
  local_108 = (char **)0x4c4b40;
  local_100 = 0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_188;
  CNode::CNode(pCVar4,idIn,sock,(CAddress *)0x0,0,(uint64_t)&local_b0,(CAddress *)&tor_addr,
               (string *)CONCAT44(in_register_0000008c,connType),INBOUND,SUB81(local_120,0),
               node_opts);
  local_158._0_8_ = pCVar4;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)vNodes,(CNode **)&local_158);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)&local_118);
  if ((pointer *)
      tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (0x10 < (uint)local_a0._M_allocated_capacity._0_4_) {
    free(local_b0.indirect_contents.indirect);
  }
  if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
  }
  pCVar4 = (vNodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
           super__Vector_impl_data._M_finish[-1];
  LOCK();
  (pCVar4->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (**(peerLogic->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&peerLogic->super_NetEventsInterface,pCVar4,9);
  LOCK();
  (pCVar4->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode(connman,pCVar4);
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddRandomOutboundPeer(NodeId& id, std::vector<CNode*>& vNodes, PeerManager& peerLogic, ConnmanTestMsg& connman, ConnectionType connType, bool onion_peer = false)
{
    CAddress addr;

    if (onion_peer) {
        auto tor_addr{m_rng.randbytes(ADDR_TORV3_SIZE)};
        BOOST_REQUIRE(addr.SetSpecial(OnionToString(tor_addr)));
    }

    while (!addr.IsRoutable()) {
        addr = CAddress(ip(m_rng.randbits(32)), NODE_NONE);
    }

    vNodes.emplace_back(new CNode{id++,
                                  /*sock=*/nullptr,
                                  addr,
                                  /*nKeyedNetGroupIn=*/0,
                                  /*nLocalHostNonceIn=*/0,
                                  CAddress(),
                                  /*addrNameIn=*/"",
                                  connType,
                                  /*inbound_onion=*/false});
    CNode &node = *vNodes.back();
    node.SetCommonVersion(PROTOCOL_VERSION);

    peerLogic.InitializeNode(node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node.fSuccessfullyConnected = true;

    connman.AddTestNode(node);
}